

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O3

unsigned_short sxhash(LispPTR obj)

{
  ushort *puVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  byte bVar7;
  ulong uVar8;
  DLword *pDVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ushort uVar15;
  
  uVar15 = 0;
  for (uVar8 = (ulong)obj; uVar13 = (uint)uVar8, (uVar13 & 0xfff0000 | 0x10000) != 0xf0000;
      uVar8 = (ulong)*(uint *)(pDVar9 + uVar8 + 2)) {
    uVar12 = (uint)(uVar8 >> 9);
    uVar11 = *(ushort *)((ulong)(uVar12 * 2) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar11 != 0x13) {
      switch(uVar11) {
      case 2:
        if ((uVar8 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        uVar13 = (uint)Lisp_world[uVar8];
        goto LAB_00132953;
      case 3:
        if ((uVar8 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        uVar13 = *(uint *)(Lisp_world + uVar8) >> 0x10 ^ *(uint *)(Lisp_world + uVar8);
        goto LAB_00132953;
      case 5:
        iVar14 = 0xd;
        uVar12 = 0;
        goto LAB_0013296f;
      case 0xe:
      case 0x10:
        if ((uVar8 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        uVar11 = Lisp_world[uVar8 + 3];
        if ((uVar11 >> 0xc & 1) != 0) {
          uVar13 = *(uint *)(Lisp_world + uVar8 + 4);
          uVar12 = 0xd;
          if (uVar13 < 0xd) {
            uVar12 = uVar13;
          }
          if ((char)uVar11 == 'D') {
            if (uVar13 != 0) {
              pDVar9 = Lisp_world +
                       (ulong)Lisp_world[uVar8 + 2] +
                       (ulong)(*(uint *)(Lisp_world + uVar8) & 0xfffffff);
              uVar11 = 0;
              do {
                uVar11 = uVar11 ^ *(ushort *)((ulong)pDVar9 ^ 2);
                uVar11 = uVar11 << 7 | uVar11 >> 9;
                uVar13 = (uint)uVar11;
                pDVar9 = pDVar9 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
              goto LAB_00132953;
            }
          }
          else if ((char)uVar11 == 'C') {
            if (uVar13 != 0) {
              uVar8 = (long)Lisp_world +
                      (ulong)Lisp_world[uVar8 + 2] +
                      (ulong)(*(uint *)(Lisp_world + uVar8) & 0xfffffff) * 2;
              uVar13 = 0;
              do {
                uVar13 = (uint)(ushort)(((ushort)uVar13 ^ (ushort)*(byte *)(uVar8 ^ 3)) << 7 |
                                       (ushort)uVar13 >> 9);
                uVar8 = uVar8 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
              goto LAB_00132953;
            }
          }
          else {
            error("SXHASH of a string not made of chars!\n");
          }
          uVar13 = 0;
          goto LAB_00132953;
        }
        if ((uVar11 >> 0xd & 1) != 0) {
          uVar12 = *(uint *)(Lisp_world + uVar8 + 4);
          uVar11 = Lisp_world[uVar8 + 2];
          puVar1 = Lisp_world +
                   (ulong)(*(uint *)(Lisp_world + uVar8) & 0xfffffff) + (ulong)(uVar11 >> 4);
          if (uVar11 == 0) {
            uVar10 = *puVar1;
          }
          else {
            bVar7 = (byte)uVar11 & 0xf;
            uVar10 = *(short *)((ulong)puVar1 ^ 2) << bVar7 |
                     *(ushort *)((ulong)(puVar1 + 1) ^ 2) >> 0x10 - bVar7;
            uVar12 = uVar12 - uVar11;
          }
          uVar13 = (uint)uVar10;
          if (uVar12 < 0x10) {
            uVar13 = (uint)(uVar10 >> (0x10U - (char)uVar12 & 0x1f));
          }
          goto LAB_00132953;
        }
        break;
      case 0x11:
        if ((uVar8 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        LVar6 = *(LispPTR *)(Lisp_world + uVar8);
        LVar5 = car(LVar6);
        LVar6 = cdr(LVar6);
        LVar6 = car(LVar6);
        uVar13 = LVar6 * 0x1000 + LVar5;
        goto LAB_00132953;
      case 0x12:
        if ((uVar8 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        pDVar9 = Lisp_world;
        uVar2 = sxhash(*(LispPTR *)(Lisp_world + uVar8));
        uVar13 = (uint)uVar2;
        uVar2 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 2));
        uVar12 = (uint)uVar2;
        goto LAB_00132951;
      case 0x14:
        if ((uVar8 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        pDVar9 = Lisp_world;
        uVar2 = sxhash(*(LispPTR *)(Lisp_world + uVar8));
        uVar3 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 2));
        uVar4 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 8));
        uVar11 = uVar4 ^ ((uVar3 ^ uVar2) << 7 | (uVar3 ^ uVar2) >> 9);
        uVar2 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 10));
        uVar11 = uVar2 ^ (uVar11 << 7 | uVar11 >> 9);
        uVar2 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 4));
        uVar11 = uVar2 ^ (uVar11 << 7 | uVar11 >> 9);
        uVar2 = sxhash(*(LispPTR *)(pDVar9 + uVar8 + 6));
        uVar11 = uVar2 ^ (uVar11 << 7 | uVar11 >> 9);
        uVar13 = (uint)(ushort)(uVar11 << 7 | uVar11 >> 9);
        goto LAB_00132953;
      }
      uVar13 = uVar13 << 3 ^ (uint)(uVar8 >> 0x10);
      uVar12 = uVar12 & 0x7f;
LAB_00132951:
      uVar13 = uVar12 ^ uVar13;
      break;
    }
    if ((uVar8 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
    }
    pDVar9 = Lisp_world;
    uVar2 = sxhash(*(LispPTR *)(Lisp_world + uVar8));
    uVar15 = uVar15 ^ uVar2;
  }
  goto LAB_00132953;
  while( true ) {
    LVar6 = car((LispPTR)uVar8);
    uVar2 = sxhash(LVar6);
    uVar11 = (ushort)uVar13 ^ uVar2;
    uVar11 = uVar11 << 7 | uVar11 >> 9;
    uVar13 = (uint)uVar11;
    LVar6 = cdr((LispPTR)uVar8);
    uVar8 = (ulong)LVar6;
    iVar14 = iVar14 + -1;
    uVar12 = (uint)uVar11;
    if (iVar14 == 0) break;
LAB_0013296f:
    uVar13 = uVar12;
    if ((*(ushort *)((ulong)((uint)(uVar8 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5)
    break;
  }
LAB_00132953:
  return (ushort)uVar13 ^ uVar15;
}

Assistant:

static unsigned short sxhash(LispPTR obj) {
  /* unsigned short hashOffset; Not Used */
  unsigned int cell;
  OneDArray *str;
  switch (SEGMASK & obj) {
    case S_POSITIVE:
    case S_NEGATIVE: return (obj & 0xFFFF);
    default:
      switch (GetTypeNumber(obj)) {
        case TYPE_FIXP: return ((FIXP_VALUE(obj)) & 0xFFFF);
        case TYPE_FLOATP:
          cell = (unsigned int)FIXP_VALUE(obj);
          return ((cell & 0xFFFF) ^ (cell >> 16));
#ifdef BIGATOMS
        case TYPE_NEWATOM: /* as for LITATOM... */
#endif                     /* BIGATOMS */

        case TYPE_LITATOM: return (EQHASHINGBITS(obj));
        case TYPE_LISTP: return (sxhash_list(obj));
        case TYPE_PATHNAME: return (sxhash_pathname(obj));
        case TYPE_ONED_ARRAY:
        case TYPE_GENERAL_ARRAY:
          str = (OneDArray *)NativeAligned4FromLAddr(obj);
          if (str->stringp) return (sxhash_string(str));
          if (str->bitp) return (sxhash_bitvec(str));
          return (EQHASHINGBITS(obj));
        case TYPE_BIGNUM: {
          LispPTR contents;
          contents = ((BIGNUM *)NativeAligned4FromLAddr(obj))->contents;
          return ((unsigned short)car(contents) + (((unsigned short)car(cdr(contents))) << 12));
        }

        case TYPE_COMPLEX: {
          COMPLEX *object;
          object = (COMPLEX *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->real) ^ sxhash(object->imaginary));
        }
        case TYPE_RATIO: {
          RATIO *object;
          object = (RATIO *)NativeAligned4FromLAddr(obj);
          return (sxhash(object->numerator) ^ sxhash(object->denominator));
        }

        default: return (EQHASHINGBITS(obj));
      }
  }
}